

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O3

ON_SubDFace * __thiscall ON_SubDHeap::FaceFromId(ON_SubDHeap *this,uint face_id)

{
  ON_SubDFace *pOVar1;
  
  if ((((1 < face_id + 1) &&
       (pOVar1 = (ON_SubDFace *)
                 ON_FixedSizePool::ElementFromId(&this->m_fspf,m_offset_face_id,face_id),
       pOVar1 != (ON_SubDFace *)0x0)) && ((pOVar1->super_ON_SubDComponentBase).m_id == face_id)) &&
     ((pOVar1->super_ON_SubDComponentBase).m_archive_id != 0xffffffff)) {
    return pOVar1;
  }
  ON_SubDIncrementErrorCount();
  return (ON_SubDFace *)0x0;
}

Assistant:

const class ON_SubDFace* ON_SubDHeap::FaceFromId(
  unsigned int face_id
  ) const
{
  if ( 0 == face_id || ON_UNSET_UINT_INDEX == face_id)
    return ON_SUBD_RETURN_ERROR(nullptr);
  const class ON_SubDFace* face = (const class ON_SubDFace*)m_fspf.ElementFromId(ON_SubDHeap::m_offset_face_id,face_id);
  if ( nullptr == face || face_id != face->m_id)
    return ON_SUBD_RETURN_ERROR(nullptr);
  if ( ON_UNSET_UINT_INDEX == face->ArchiveId() )
    return ON_SUBD_RETURN_ERROR(nullptr);
  return face;
}